

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_noderel.cc
# Opt level: O0

RC __thiscall QL_NodeRel::OpenIt(QL_NodeRel *this)

{
  RC RVar1;
  RC rc;
  QL_NodeRel *this_local;
  
  (this->super_QL_Node).isOpen = true;
  if ((this->useIndex & 1U) == 0) {
    RVar1 = RM_Manager::OpenFile(((this->super_QL_Node).qlm)->rmm,this->relName,&this->fh);
    if (RVar1 != 0) {
      return RVar1;
    }
    this_local._4_4_ = RM_FileScan::OpenScan(&this->fs,&this->fh,INT,4,0,NO_OP,(void *)0x0,NO_HINT);
  }
  else {
    RVar1 = IX_Manager::OpenIndex
                      (((this->super_QL_Node).qlm)->ixm,this->relName,this->indexNo,&this->ih);
    if (RVar1 != 0) {
      return RVar1;
    }
    RVar1 = IX_IndexScan::OpenScan(&this->is,&this->ih,EQ_OP,this->value,NO_HINT);
    if (RVar1 != 0) {
      return RVar1;
    }
    this_local._4_4_ =
         RM_Manager::OpenFile(((this->super_QL_Node).qlm)->rmm,this->relName,&this->fh);
  }
  if (this_local._4_4_ == 0) {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

RC QL_NodeRel::OpenIt(){
  RC rc = 0;
  isOpen = true;
  if(useIndex){
    if((rc = qlm.ixm.OpenIndex(relName, indexNo, ih)))
      return (rc);
    if((rc = is.OpenScan(ih, EQ_OP, value)))
      return (rc);
    if((rc = qlm.rmm.OpenFile(relName, fh)))
      return (rc);
  }
  else{
    if((rc = qlm.rmm.OpenFile(relName, fh)))
      return (rc);
    if((rc = fs.OpenScan(fh, INT, 4, 0, NO_OP, NULL)))
      return (rc);
  }
  return (0);
}